

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus Decode3RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  
  uVar1 = Insn >> 6 & 0x1f;
  Decoder_00 = (void *)(ulong)uVar1;
  if (uVar1 < 0x1b) {
    DVar2 = MCDisassembler_Success;
    DecodeGRRegsRegisterClass(Inst,(Insn >> 4 & 3) + (uVar1 % 3) * 4,Address,Decoder_00);
    DecodeGRRegsRegisterClass
              (Inst,(Insn >> 2 & 3) + (uVar1 / 3 + (uVar1 / 9) * -3) * 4,Address,Decoder_00);
    DecodeGRRegsRegisterClass(Inst,(Insn & 3) + (uVar1 / 9) * 4,Address,Decoder_00);
  }
  else {
    DVar2 = MCDisassembler_Fail;
  }
  return DVar2;
}

Assistant:

static DecodeStatus Decode3RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3;
	DecodeStatus S = Decode3OpInstruction(Insn, &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	}

	return S;
}